

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_encode_tiles_row_mt(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  int *__s;
  MACROBLOCKD *xd_00;
  AV1LfSync *lf_sync;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t uVar5;
  uint uVar6;
  SequenceHeader *pSVar7;
  EncWorkerData *pEVar8;
  LFWorkerData *pLVar9;
  ENTROPY_CONTEXT *pEVar10;
  AVxWorker *pAVar11;
  MB_MODE_INFO *pMVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  aom_codec_err_t aVar16;
  int iVar17;
  int iVar18;
  AV1LfMTInfo *pAVar19;
  AVxWorkerInterface *pAVar20;
  AVxWorker *pAVar21;
  byte bVar22;
  ulong uVar23;
  int lf_id;
  size_t __n;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int i;
  int iVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  TileDataEnc *pTVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  MACROBLOCKD *xd;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar6 = (cpi->common).tiles.cols;
  uVar23 = (ulong)uVar6;
  iVar39 = (cpi->common).mi_params.mi_rows;
  bVar22 = (byte)((cpi->common).seq_params)->mib_size_log2;
  iVar34 = iVar39 + (1 << (bVar22 & 0x1f)) + -1 >> (bVar22 & 0x1f);
  iVar18 = (cpi->common).tiles.rows;
  lVar37 = (long)iVar18;
  iVar17 = 0;
  uVar41 = 0;
  if (0 < lVar37) {
    iVar24 = (cpi->common).tiles.row_start_sb[0];
    lVar25 = 0;
    uVar28 = 0;
    do {
      iVar30 = iVar24 << (bVar22 & 0x1f);
      iVar24 = (cpi->common).tiles.row_start_sb[lVar25 + 1];
      iVar33 = iVar24 << (bVar22 & 0x1f);
      lVar25 = lVar25 + 1;
      if (iVar39 <= iVar33) {
        iVar33 = iVar39;
      }
      uVar40 = (~(-1 << (bVar22 & 0x1f)) - iVar30) + iVar33 >> (bVar22 & 0x1f);
      if ((int)uVar40 < (int)uVar28) {
        uVar40 = uVar28;
      }
      uVar28 = uVar40;
      uVar41 = (ulong)uVar28;
    } while (lVar37 != lVar25);
  }
  if (0 < (int)uVar6) {
    iVar39 = (cpi->common).mi_params.mi_cols;
    iVar24 = (cpi->common).tiles.col_start_sb[0];
    uVar26 = 0;
    iVar17 = 0;
    do {
      iVar30 = iVar24 << (bVar22 & 0x1f);
      iVar24 = (cpi->common).tiles.col_start_sb[uVar26 + 1];
      iVar33 = iVar24 << (bVar22 & 0x1f);
      uVar26 = uVar26 + 1;
      if (iVar39 <= iVar33) {
        iVar33 = iVar39;
      }
      iVar33 = (~(-1 << (bVar22 & 0x1f)) - iVar30) + iVar33 >> (bVar22 & 0x1f);
      if (iVar17 <= iVar33) {
        iVar17 = iVar33;
      }
    } while (uVar23 != uVar26);
  }
  bVar42 = true;
  if (((((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar6) &&
       ((cpi->mt_info).enc_row_mt.allocated_tile_rows == iVar18)) &&
      ((cpi->mt_info).enc_row_mt.allocated_rows == (int)uVar41)) &&
     ((cpi->mt_info).enc_row_mt.allocated_cols == iVar17 + -1)) {
    bVar42 = (cpi->mt_info).enc_row_mt.allocated_sb_rows != iVar34;
  }
  uVar28 = (cpi->mt_info).num_mod_workers[4];
  if (cpi->allocated_tiles < (int)(uVar6 * iVar18)) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar42) {
    row_mt_mem_alloc(cpi,(int)uVar41,iVar17,(uint)(cpi->oxcf).algo_cfg.cdf_update_mode);
  }
  uVar40 = (cpi->mt_info).num_workers;
  if ((int)uVar28 < (int)uVar40) {
    uVar40 = uVar28;
  }
  bVar42 = (cpi->common).features.coded_lossless;
  bVar44 = true;
  bVar43 = true;
  if (bVar42 == false) {
    bVar43 = (cpi->common).tiles.large_scale != 0;
  }
  pSVar7 = (cpi->common).seq_params;
  if (pSVar7->enable_cdef != '\0' && bVar42 == false) {
    bVar44 = (cpi->common).tiles.large_scale != 0;
  }
  if ((pSVar7->enable_restoration == '\0') || ((cpi->common).features.all_lossless != false)) {
    bVar42 = false;
  }
  else {
    bVar42 = (cpi->common).tiles.large_scale == 0;
  }
  iVar39 = (cpi->ppi->rtc_ref).non_reference_frame;
  if (iVar39 == 0) {
    bVar22 = 1;
    if ((cpi->oxcf).algo_cfg.skip_postproc_filtering == true) {
      bVar22 = bVar42 | (cpi->common).width != (cpi->common).superres_upscaled_width |
               cpi->ppi->b_calculate_psnr != 0;
      if (bVar44 || bVar22 != 0) {
        bVar22 = bVar22 | bVar43;
      }
      else {
        bVar22 = (cpi->sf).lpf_sf.cdef_pick_method != CDEF_PICK_FROM_Q | bVar43;
      }
    }
  }
  else {
    bVar22 = 0;
  }
  cm = &cpi->common;
  __s = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id;
  xd_00 = &(cpi->td).mb.e_mbd;
  uVar26 = (ulong)uVar40;
  if ((((cpi->oxcf).mode == '\x01') && (4 < (cpi->oxcf).speed)) &&
     (((cpi->sf).lpf_sf.lpf_pick == '\x03' &&
      ((iVar39 == 0 && ((cpi->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY)))))) {
    bVar22 = ((cpi->common).features.allow_intrabc ^ 1U) & bVar22;
    (cpi->mt_info).pipeline_lpf_mt_with_enc = (uint)bVar22;
    if (bVar22 == 1) {
      (cpi->common).lf.filter_level[0] = 0;
      (cpi->common).lf.filter_level[1] = 0;
      (cpi->common).lf.backup_filter_level[0] = 0;
      (cpi->common).lf.backup_filter_level[1] = 0;
      (cpi->common).cdef_info.cdef_bits = 0;
      (cpi->common).cdef_info.nb_cdef_strengths = 1;
      (cpi->common).cdef_info.cdef_strengths[0] = 0;
      (cpi->common).cdef_info.cdef_uv_strengths[0] = 0;
      (cpi->common).rst_info[0].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
      (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
      if (bVar43 == false) {
        av1_pick_filter_level(cpi->source,cpi,'\x03');
        uVar5 = ((cpi->common).seq_params)->monochrome;
        if (((cpi->mt_info).pipeline_lpf_mt_with_enc != 0) &&
           (((cpi->common).lf.filter_level[0] != 0 || ((cpi->common).lf.filter_level[1] != 0)))) {
          local_1d0.error_code = AOM_CODEC_ERROR;
          uVar3 = (cpi->common).lf.filter_level_u;
          uVar4 = (cpi->common).lf.filter_level_v;
          local_1d0._4_8_ =
               ~CONCAT44(-(uint)(uVar4 == 0),-(uint)(uVar3 == 0)) &
               (ulong)CONCAT14(uVar5 == '\0',(uint)(uVar5 == '\0')) & (ulong)DAT_004e6780;
          iVar39 = 0;
          if ((0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_rect) &&
             (0 < (cpi->sf).tx_sf.inter_tx_size_search_init_depth_sqr)) {
            iVar39 = ((cpi->sf).lpf_sf.lpf_pick == '\x03') + 1;
          }
          iVar17 = (cpi->common).mi_params.mi_rows;
          av1_loop_filter_frame_init(cm,0,(uint)(uVar5 == '\0') * 2 + 1);
          bVar22 = (byte)((cpi->common).seq_params)->mib_size_log2;
          iVar30 = 1 << (bVar22 & 0x1f);
          bVar22 = bVar22 & 0x1f;
          iVar33 = (cpi->common).mi_params.mi_rows + iVar30 + -1 >> bVar22;
          iVar24 = (cpi->mt_info).num_mod_workers[5];
          lf_sync = &(cpi->mt_info).lf_row_sync;
          if ((((cpi->mt_info).lf_row_sync.sync_range == 0) ||
              (iVar33 != (cpi->mt_info).lf_row_sync.rows)) ||
             ((cpi->mt_info).lf_row_sync.num_workers < iVar24)) {
            av1_loop_filter_dealloc(lf_sync);
            av1_loop_filter_alloc(lf_sync,cm,iVar33,(cpi->common).width,iVar24);
          }
          (cpi->mt_info).lf_row_sync.lf_mt_exit = false;
          uVar35 = (ulong)(uint)(0 >> bVar22);
          do {
            memset((cpi->mt_info).lf_row_sync.cur_sb_col[uVar35],0xff,(long)iVar33 << 2);
            uVar35 = uVar35 + 1;
          } while (uVar35 != 3);
          pAVar19 = (cpi->mt_info).lf_row_sync.job_queue;
          (cpi->mt_info).lf_row_sync.jobs_enqueued = 0;
          (cpi->mt_info).lf_row_sync.jobs_dequeued = 0;
          iVar24 = 0;
          iVar33 = 0;
          bVar42 = true;
          do {
            bVar43 = bVar42;
            if (0 < iVar17) {
              iVar29 = 0;
              do {
                lVar25 = 0;
                do {
                  iVar31 = (int)lVar25;
                  if (iVar39 == 2) {
                    if (iVar31 != 2) {
                      aVar16 = local_1d0.error_code;
                      if (iVar31 != 1) goto joined_r0x001cd83a;
                      if (local_1d0.detail._0_4_ == 0 && local_1d0.has_detail == 0)
                      goto LAB_001cd866;
                      goto LAB_001cd845;
                    }
                  }
                  else {
                    aVar16 = *(aom_codec_err_t *)(local_1d0.detail + lVar25 * 4 + -8);
joined_r0x001cd83a:
                    if (aVar16 != AOM_CODEC_OK) {
LAB_001cd845:
                      if (*(int *)(local_1d0.detail + lVar25 * 4 + -8) != 0) {
                        pAVar19->mi_row = iVar29;
                        pAVar19->plane = iVar31;
                        pAVar19->dir = iVar33;
                        pAVar19->lpf_opt_level = iVar39;
                        pAVar19 = pAVar19 + 1;
                        iVar24 = iVar24 + 1;
                        (cpi->mt_info).lf_row_sync.jobs_enqueued = iVar24;
                      }
                    }
                  }
LAB_001cd866:
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 3);
                iVar29 = iVar29 + iVar30;
              } while (iVar29 < iVar17);
            }
            iVar33 = 1;
            bVar42 = false;
          } while (bVar43);
          if (0 < (int)uVar40) {
            lVar25 = uVar26 * 0x2268 + -0x2248;
            uVar35 = uVar26;
            do {
              uVar27 = uVar35 - 1;
              pEVar8 = (cpi->mt_info).tile_thr_data;
              pEVar8[uVar27].lf_sync = lf_sync;
              pLVar9 = (cpi->mt_info).lf_row_sync.lfdata;
              pEVar8[uVar27].lf_data = pLVar9 + uVar27;
              pLVar9[uVar27].frame_buffer = &((cpi->common).cur_frame)->buf;
              pLVar9[uVar27].cm = cm;
              pLVar9[uVar27].xd = xd_00;
              lVar32 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(cpi->td).mb.e_mbd.plane[0].pre[-1].buf + lVar32);
                uVar13 = *puVar1;
                uVar14 = puVar1[1];
                puVar1 = (undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar32 + -0x10);
                uVar15 = puVar1[1];
                puVar2 = (undefined8 *)((long)pLVar9->planes[0].pre + lVar32 + lVar25 + -0x30);
                *puVar2 = *puVar1;
                puVar2[1] = uVar15;
                puVar1 = (undefined8 *)((long)(pLVar9->planes[0].pre + -2) + lVar32 + lVar25);
                *puVar1 = uVar13;
                puVar1[1] = uVar14;
                *(undefined8 *)((long)pLVar9->planes[0].pre + lVar32 + lVar25 + -0x4c) =
                     *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar32 + -0x2c);
                lVar32 = lVar32 + 0xa30;
              } while (lVar32 != 0x1e90);
              lVar25 = lVar25 + -0x2268;
              bVar42 = 1 < (long)uVar35;
              uVar35 = uVar27;
            } while (bVar42);
          }
        }
      }
    }
  }
  else {
    (cpi->mt_info).pipeline_lpf_mt_with_enc = 0;
  }
  av1_init_tile_data(cpi);
  memset(__s,0xff,0x100);
  memset((cpi->mt_info).enc_row_mt.num_tile_cols_done,0,(long)iVar34 << 2);
  (cpi->mt_info).enc_row_mt.row_mt_exit = false;
  if (0 < iVar18) {
    lVar25 = 0;
    lVar32 = 0;
    do {
      uVar35 = uVar23;
      lVar36 = lVar25;
      if (0 < (int)uVar6) {
        do {
          pTVar38 = cpi->tile_data;
          memset(*(void **)((long)&(pTVar38->row_mt_sync).num_finished_cols + lVar36),0xff,
                 uVar41 << 2);
          *(undefined4 *)((long)&(pTVar38->row_mt_sync).next_mi_row + lVar36) =
               *(undefined4 *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x2e + lVar36);
          *(undefined4 *)((long)&(pTVar38->row_mt_sync).num_threads_working + lVar36) = 0;
          iVar39 = av1_get_intrabc_extra_top_right_sb_delay(cm);
          *(int *)((long)&(pTVar38->row_mt_sync).intrabc_extra_top_right_sb_delay + lVar36) = iVar39
          ;
          av1_inter_mode_data_init
                    ((TileDataEnc *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x2e + lVar36));
          iVar39 = *(int *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x36 + lVar36);
          pSVar7 = (cpi->common).seq_params;
          uVar27 = -1L << ((byte)pSVar7->mib_size_log2 & 0x3f);
          bVar22 = (byte)pSVar7->subsampling_x;
          uVar27 = (long)(int)(~(uint)uVar27 +
                              (*(int *)((long)((pTVar38->tctx).txb_skip_cdf + -1) + 0x3a + lVar36) -
                              iVar39)) & uVar27;
          iVar17 = iVar39 >> (bVar22 & 0x1f);
          uVar5 = pSVar7->monochrome;
          memset((cpi->common).above_contexts.entropy[0][lVar32] + iVar39,0,uVar27);
          if (uVar5 == '\0') {
            pEVar10 = (cpi->common).above_contexts.entropy[1][lVar32];
            if ((pEVar10 == (ENTROPY_CONTEXT *)0x0) ||
               ((cpi->common).above_contexts.entropy[2][lVar32] == (ENTROPY_CONTEXT *)0x0)) {
              aom_internal_error((cpi->td).mb.e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,
                                 "Invalid value of planes");
            }
            else {
              __n = (size_t)((int)uVar27 >> (bVar22 & 0x1f));
              memset(pEVar10 + iVar17,0,__n);
              memset((cpi->common).above_contexts.entropy[2][lVar32] + iVar17,0,__n);
            }
          }
          memset((cpi->common).above_contexts.partition[lVar32] + iVar39,0,uVar27);
          memset((cpi->common).above_contexts.txfm[lVar32] + iVar39,0x40,uVar27);
          lVar36 = lVar36 + 0x5d10;
          uVar35 = uVar35 - 1;
        } while (uVar35 != 0);
      }
      lVar32 = lVar32 + 1;
      lVar25 = lVar25 + uVar23 * 0x5d10;
    } while (lVar32 != lVar37);
  }
  if (0 < (int)uVar40) {
    uVar23 = 0;
    iVar39 = 0;
    do {
      __s[uVar23] = iVar39;
      iVar39 = iVar39 + 1;
      if (iVar39 == uVar6 * iVar18) {
        iVar39 = 0;
      }
      uVar23 = uVar23 + 1;
    } while (uVar26 != uVar23);
  }
  prepare_enc_workers(cpi,enc_row_mt_worker_hook,uVar40);
  pAVar20 = aom_get_worker_interface();
  if (0 < (int)uVar40) {
    lVar37 = uVar26 - 1;
    pAVar11 = (cpi->mt_info).workers;
    pAVar21 = pAVar11 + lVar37;
    pAVar11[lVar37].had_error = 0;
    if (lVar37 != 0) {
      lVar25 = uVar26 * -0x38 + 0x38;
      lVar32 = uVar26 * 0x38 + -0x40;
      do {
        (*pAVar20->launch)(pAVar21);
        lVar37 = lVar37 + -1;
        pAVar11 = (cpi->mt_info).workers;
        pAVar21 = pAVar11 + lVar37;
        *(undefined4 *)((long)&pAVar11->impl_ + lVar32) = 0;
        lVar25 = lVar25 + 0x38;
        lVar32 = lVar32 + -0x38;
      } while (lVar37 != 0);
      pAVar21 = (AVxWorker *)((long)pAVar11 - lVar25);
    }
    (*pAVar20->execute)(pAVar21);
  }
  pAVar20 = aom_get_worker_interface();
  pAVar21 = (cpi->mt_info).workers;
  iVar39 = pAVar21->had_error;
  if (iVar39 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar21->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar40) {
    uVar23 = uVar26 + 1;
    lVar37 = uVar26 * 0x38;
    do {
      pAVar11 = (cpi->mt_info).workers;
      iVar18 = (*pAVar20->sync)((AVxWorker *)((long)&pAVar11[-1].impl_ + lVar37));
      if (iVar18 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar11[-1].data1 + lVar37) + 0x18),0x1a0);
        iVar39 = 1;
      }
      uVar23 = uVar23 - 1;
      lVar37 = lVar37 + -0x38;
    } while (2 < uVar23);
  }
  if (iVar39 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar21->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (((cpi->common).delta_q_info.delta_lf_present_flag != 0) &&
     (iVar39 = (cpi->common).tiles.rows, 0 < iVar39)) {
    pSVar7 = (cpi->common).seq_params;
    iVar18 = pSVar7->mib_size;
    iVar17 = (cpi->common).tiles.cols;
    lVar37 = (ulong)(pSVar7->monochrome == '\0') * 2 + 2;
    iVar24 = 0;
    iVar34 = iVar17;
    do {
      if (0 < iVar34) {
        iVar39 = 0;
        do {
          pTVar38 = cpi->tile_data;
          iVar33 = iVar34 * iVar24 + iVar39;
          iVar34 = pTVar38[iVar33].tile_info.mi_row_start;
          if (iVar34 < pTVar38[iVar33].tile_info.mi_row_end) {
            pTVar38 = pTVar38 + iVar33;
            do {
              if (iVar34 == (pTVar38->tile_info).mi_row_start) {
                av1_reset_loop_filter_delta
                          (xd_00,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
              }
              for (iVar17 = (pTVar38->tile_info).mi_col_start;
                  iVar17 < (pTVar38->tile_info).mi_col_end; iVar17 = iVar17 + iVar18) {
                pMVar12 = (cpi->common).mi_params.mi_grid_base
                          [(cpi->common).mi_params.mi_stride * iVar34 + iVar17];
                if ((pMVar12->skip_txfm == '\x01') &&
                   (pMVar12->bsize == ((cpi->common).seq_params)->sb_size)) {
                  lVar25 = 0;
                  do {
                    pMVar12->delta_lf[lVar25] = (cpi->td).mb.e_mbd.delta_lf[lVar25];
                    lVar25 = lVar25 + 1;
                  } while (lVar37 != lVar25);
                  pMVar12->delta_lf_from_base = (cpi->td).mb.e_mbd.delta_lf_from_base;
                }
                else if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
                  (cpi->td).mb.e_mbd.delta_lf_from_base = pMVar12->delta_lf_from_base;
                }
                else {
                  lVar25 = 0;
                  do {
                    (cpi->td).mb.e_mbd.delta_lf[lVar25] = pMVar12->delta_lf[lVar25];
                    lVar25 = lVar25 + 1;
                  } while (lVar37 != lVar25);
                }
              }
              iVar34 = iVar34 + iVar18;
            } while (iVar34 < (pTVar38->tile_info).mi_row_end);
            iVar17 = (cpi->common).tiles.cols;
          }
          iVar39 = iVar39 + 1;
          iVar34 = iVar17;
        } while (iVar39 < iVar17);
        iVar39 = (cpi->common).tiles.rows;
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < iVar39);
  }
  accumulate_counters_enc_workers(cpi,uVar40);
  return;
}

Assistant:

void av1_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int sb_rows_in_frame = get_sb_rows_in_frame(cm);
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int max_sb_rows_in_tile = 0, max_sb_cols_in_tile = 0;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  compute_max_sb_rows_cols(cm, &max_sb_rows_in_tile, &max_sb_cols_in_tile);
  const bool alloc_row_mt_mem =
      (enc_row_mt->allocated_tile_cols != tile_cols ||
       enc_row_mt->allocated_tile_rows != tile_rows ||
       enc_row_mt->allocated_rows != max_sb_rows_in_tile ||
       enc_row_mt->allocated_cols != (max_sb_cols_in_tile - 1) ||
       enc_row_mt->allocated_sb_rows != sb_rows_in_frame);
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_sb_rows_in_tile, max_sb_cols_in_tile,
                     cpi->oxcf.algo_cfg.cdf_update_mode);
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  lpf_pipeline_mt_init(cpi, num_workers);

  av1_init_tile_data(cpi);

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  memset(enc_row_mt->num_tile_cols_done, 0,
         sizeof(*enc_row_mt->num_tile_cols_done) * sb_rows_in_frame);
  enc_row_mt->row_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_sb_rows_in_tile);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;
      row_mt_sync->intrabc_extra_top_right_sb_delay =
          av1_get_intrabc_extra_top_right_sb_delay(cm);

      av1_inter_mode_data_init(this_tile);
      av1_zero_above_context(cm, &cpi->td.mb.e_mbd,
                             this_tile->tile_info.mi_col_start,
                             this_tile->tile_info.mi_col_end, tile_row);
    }
  }

  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  prepare_enc_workers(cpi, enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  if (cm->delta_q_info.delta_lf_present_flag) update_delta_lf_for_row_mt(cpi);
  accumulate_counters_enc_workers(cpi, num_workers);
}